

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleCreateLinkCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer *this_00;
  cmMakefile *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  __type _Var4;
  size_type sVar5;
  reference __rhs;
  string *psVar6;
  ulong uVar7;
  char *pcVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  bool local_5f9;
  undefined1 local_5f8 [7];
  bool completed;
  string local_5d8 [32];
  string local_5b8 [32];
  undefined1 local_598 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3e0 [8];
  string result;
  string *resultVar;
  string newFileName;
  string fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  undefined1 local_330 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unconsumedArgs;
  cmCAEnabler symbolicArg;
  cmCAEnabler copyOnErrorArg;
  cmCAString resultArg;
  cmCAString newFileArg;
  cmCAString fileArg;
  cmCAString linkArg;
  cmCommandArgumentGroup group;
  cmCommandArgumentsHelper argHelper;
  allocator<char> local_41;
  string local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  local_20 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar5 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "CREATE_LINK must be called with at least two additional arguments",&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = 0;
    goto LAB_00332637;
  }
  this_00 = &group.ContainedArguments.
             super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  cmCommandArgumentsHelper::cmCommandArgumentsHelper((cmCommandArgumentsHelper *)this_00);
  cmCommandArgumentGroup::cmCommandArgumentGroup((cmCommandArgumentGroup *)&linkArg.DataStart);
  cmCAString::cmCAString
            ((cmCAString *)&fileArg.DataStart,(cmCommandArgumentsHelper *)this_00,"CREATE_LINK",
             (cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString
            ((cmCAString *)&newFileArg.DataStart,
             (cmCommandArgumentsHelper *)
             &group.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString
            ((cmCAString *)&resultArg.DataStart,
             (cmCommandArgumentsHelper *)
             &group.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(char *)0x0,(cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString
            ((cmCAString *)&copyOnErrorArg.Enabled,
             (cmCommandArgumentsHelper *)
             &group.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"RESULT",
             (cmCommandArgumentGroup *)&linkArg.DataStart);
  cmCAEnabler::cmCAEnabler
            ((cmCAEnabler *)&symbolicArg.Enabled,
             (cmCommandArgumentsHelper *)
             &group.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"COPY_ON_ERROR",
             (cmCommandArgumentGroup *)&linkArg.DataStart);
  cmCAEnabler::cmCAEnabler
            ((cmCAEnabler *)
             &unconsumedArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmCommandArgumentsHelper *)
             &group.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"SYMBOLIC",
             (cmCommandArgumentGroup *)&linkArg.DataStart);
  cmCommandArgument::Follows((cmCommandArgument *)&fileArg.DataStart,(cmCommandArgument *)0x0);
  cmCommandArgument::Follows
            ((cmCommandArgument *)&newFileArg.DataStart,(cmCommandArgument *)&fileArg.DataStart);
  cmCommandArgument::Follows
            ((cmCommandArgument *)&resultArg.DataStart,(cmCommandArgument *)&newFileArg.DataStart);
  cmCommandArgumentGroup::Follows
            ((cmCommandArgumentGroup *)&linkArg.DataStart,(cmCommandArgument *)&resultArg.DataStart)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_330);
  cmCommandArgumentsHelper::Parse
            ((cmCommandArgumentsHelper *)
             &group.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_20,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_330);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_330);
  if (bVar3) {
    psVar6 = cmCAString::GetString_abi_cxx11_((cmCAString *)&newFileArg.DataStart);
    std::__cxx11::string::string((string *)(newFileName.field_2._M_local_buf + 8),(string *)psVar6);
    psVar6 = cmCAString::GetString_abi_cxx11_((cmCAString *)&resultArg.DataStart);
    std::__cxx11::string::string((string *)&resultVar,(string *)psVar6);
    result.field_2._8_8_ = cmCAString::GetString_abi_cxx11_((cmCAString *)&copyOnErrorArg.Enabled);
    std::__cxx11::string::string((string *)local_3e0);
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&newFileName.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &resultVar);
    if (_Var4) {
      std::__cxx11::string::operator=
                ((string *)local_3e0,"CREATE_LINK cannot use same file and newfile");
      uVar7 = std::__cxx11::string::empty();
      uVar2 = result.field_2._8_8_;
      if ((uVar7 & 1) == 0) {
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)uVar2,pcVar8);
        this_local._7_1_ = 1;
      }
      else {
        cmCommand::SetError(&this->super_cmCommand,(string *)local_3e0);
        this_local._7_1_ = 0;
      }
    }
    else {
      bVar3 = cmCAEnabler::IsEnabled
                        ((cmCAEnabler *)
                         &unconsumedArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((bVar3) ||
         (bVar3 = cmsys::SystemTools::FileExists((string *)((long)&newFileName.field_2 + 8)), bVar3)
         ) {
        bVar3 = cmsys::SystemTools::FileExists((string *)&resultVar);
        if (((!bVar3) && (bVar3 = cmsys::SystemTools::FileIsSymlink((string *)&resultVar), !bVar3))
           || (bVar3 = cmsys::SystemTools::RemoveFile((string *)&resultVar), bVar3)) {
          local_5f9 = false;
          bVar3 = cmCAEnabler::IsEnabled
                            ((cmCAEnabler *)
                             &unconsumedArgs.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (bVar3) {
            local_5f9 = cmSystemTools::CreateSymlink
                                  ((string *)((long)&newFileName.field_2 + 8),(string *)&resultVar,
                                   (string *)local_3e0);
          }
          else {
            local_5f9 = cmSystemTools::CreateLink
                                  ((string *)((long)&newFileName.field_2 + 8),(string *)&resultVar,
                                   (string *)local_3e0);
          }
          if (((local_5f9 == false) &&
              (bVar3 = cmCAEnabler::IsEnabled((cmCAEnabler *)&symbolicArg.Enabled), bVar3)) &&
             (local_5f9 = cmsys::SystemTools::CopyFileAlways
                                    ((string *)((long)&newFileName.field_2 + 8),(string *)&resultVar
                                    ), !local_5f9)) {
            cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
            std::operator+(&local_620,"Copy failed: ",&local_640);
            std::__cxx11::string::operator=((string *)local_3e0,(string *)&local_620);
            std::__cxx11::string::~string((string *)&local_620);
            std::__cxx11::string::~string((string *)&local_640);
          }
          if ((local_5f9 & 1U) == 0) {
            uVar7 = std::__cxx11::string::empty();
            if ((uVar7 & 1) != 0) {
              cmCommand::SetError(&this->super_cmCommand,(string *)local_3e0);
              this_local._7_1_ = 0;
              goto LAB_0033251b;
            }
          }
          else {
            std::__cxx11::string::operator=((string *)local_3e0,"0");
          }
          uVar7 = std::__cxx11::string::empty();
          uVar2 = result.field_2._8_8_;
          if ((uVar7 & 1) == 0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(pcVar1,(string *)uVar2,pcVar8);
          }
          this_local._7_1_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
          poVar9 = std::operator<<((ostream *)local_598,"Failed to create link \'");
          poVar9 = std::operator<<(poVar9,(string *)&resultVar);
          poVar9 = std::operator<<(poVar9,"\' because existing path cannot be removed: ");
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          poVar9 = std::operator<<(poVar9,local_5b8);
          std::operator<<(poVar9,"\n");
          std::__cxx11::string::~string(local_5b8);
          uVar7 = std::__cxx11::string::empty();
          uVar2 = result.field_2._8_8_;
          bVar3 = (uVar7 & 1) != 0;
          if (bVar3) {
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_5f8);
            std::__cxx11::string::~string((string *)local_5f8);
          }
          else {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(pcVar1,(string *)uVar2,pcVar8);
            std::__cxx11::string::~string(local_5d8);
          }
          this_local._7_1_ = !bVar3;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
        }
      }
      else {
        std::operator+(&local_420,"Cannot hard link \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&newFileName.field_2 + 8));
        std::operator+(&local_400,&local_420,"\' as it does not exist.");
        std::__cxx11::string::operator=((string *)local_3e0,(string *)&local_400);
        std::__cxx11::string::~string((string *)&local_400);
        std::__cxx11::string::~string((string *)&local_420);
        uVar7 = std::__cxx11::string::empty();
        uVar2 = result.field_2._8_8_;
        if ((uVar7 & 1) == 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(pcVar1,(string *)uVar2,pcVar8);
          this_local._7_1_ = 1;
        }
        else {
          cmCommand::SetError(&this->super_cmCommand,(string *)local_3e0);
          this_local._7_1_ = 0;
        }
      }
    }
LAB_0033251b:
    std::__cxx11::string::~string((string *)local_3e0);
    std::__cxx11::string::~string((string *)&resultVar);
    std::__cxx11::string::~string((string *)(newFileName.field_2._M_local_buf + 8));
  }
  else {
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_330);
    std::operator+(&local_370,"unknown argument: \"",__rhs);
    std::operator+(&local_350,&local_370,'\"');
    cmCommand::SetError(&this->super_cmCommand,&local_350);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    this_local._7_1_ = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_330);
  cmCAEnabler::~cmCAEnabler
            ((cmCAEnabler *)
             &unconsumedArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::~cmCAEnabler((cmCAEnabler *)&symbolicArg.Enabled);
  cmCAString::~cmCAString((cmCAString *)&copyOnErrorArg.Enabled);
  cmCAString::~cmCAString((cmCAString *)&resultArg.DataStart);
  cmCAString::~cmCAString((cmCAString *)&newFileArg.DataStart);
  cmCAString::~cmCAString((cmCAString *)&fileArg.DataStart);
  cmCommandArgumentGroup::~cmCommandArgumentGroup((cmCommandArgumentGroup *)&linkArg.DataStart);
  cmCommandArgumentsHelper::~cmCommandArgumentsHelper
            ((cmCommandArgumentsHelper *)
             &group.ContainedArguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_00332637:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleCreateLinkCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("CREATE_LINK must be called with at least two additional "
                   "arguments");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString linkArg(&argHelper, "CREATE_LINK");
  cmCAString fileArg(&argHelper, nullptr);
  cmCAString newFileArg(&argHelper, nullptr);

  cmCAString resultArg(&argHelper, "RESULT", &group);
  cmCAEnabler copyOnErrorArg(&argHelper, "COPY_ON_ERROR", &group);
  cmCAEnabler symbolicArg(&argHelper, "SYMBOLIC", &group);

  linkArg.Follows(nullptr);
  fileArg.Follows(&linkArg);
  newFileArg.Follows(&fileArg);
  group.Follows(&newFileArg);

  std::vector<std::string> unconsumedArgs;
  argHelper.Parse(&args, &unconsumedArgs);

  if (!unconsumedArgs.empty()) {
    this->SetError("unknown argument: \"" + unconsumedArgs.front() + '\"');
    return false;
  }

  std::string fileName = fileArg.GetString();
  std::string newFileName = newFileArg.GetString();

  // Output variable for storing the result.
  const std::string& resultVar = resultArg.GetString();

  // The system error message generated in the operation.
  std::string result;

  // Check if the paths are distinct.
  if (fileName == newFileName) {
    result = "CREATE_LINK cannot use same file and newfile";
    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Hard link requires original file to exist.
  if (!symbolicArg.IsEnabled() && !cmSystemTools::FileExists(fileName)) {
    result = "Cannot hard link \'" + fileName + "\' as it does not exist.";
    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, result.c_str());
      return true;
    }
    this->SetError(result);
    return false;
  }

  // Check if the new file already exists and remove it.
  if ((cmSystemTools::FileExists(newFileName) ||
       cmSystemTools::FileIsSymlink(newFileName)) &&
      !cmSystemTools::RemoveFile(newFileName)) {
    std::ostringstream e;
    e << "Failed to create link '" << newFileName
      << "' because existing path cannot be removed: "
      << cmSystemTools::GetLastSystemError() << "\n";

    if (!resultVar.empty()) {
      this->Makefile->AddDefinition(resultVar, e.str().c_str());
      return true;
    }
    this->SetError(e.str());
    return false;
  }

  // Whether the operation completed successfully.
  bool completed = false;

  // Check if the command requires a symbolic link.
  if (symbolicArg.IsEnabled()) {
    completed = cmSystemTools::CreateSymlink(fileName, newFileName, &result);
  } else {
    completed = cmSystemTools::CreateLink(fileName, newFileName, &result);
  }

  // Check if copy-on-error is enabled in the arguments.
  if (!completed && copyOnErrorArg.IsEnabled()) {
    completed = cmsys::SystemTools::CopyFileAlways(fileName, newFileName);
    if (!completed) {
      result = "Copy failed: " + cmSystemTools::GetLastSystemError();
    }
  }

  // Check if the operation was successful.
  if (completed) {
    result = "0";
  } else if (resultVar.empty()) {
    // The operation failed and the result is not reported in a variable.
    this->SetError(result);
    return false;
  }

  if (!resultVar.empty()) {
    this->Makefile->AddDefinition(resultVar, result.c_str());
  }

  return true;
}